

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_show_ab(REF_INT rows,REF_INT cols,REF_DBL *ab)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  REF_DBL *pRVar4;
  ulong uVar5;
  
  uVar1 = cols;
  if (cols < 1) {
    uVar1 = 0;
  }
  uVar2 = 0;
  if (0 < rows) {
    uVar2 = (ulong)(uint)rows;
  }
  for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    pRVar4 = ab;
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      printf("%12.4e",*pRVar4);
      if ((long)uVar5 < (long)(cols + -1)) {
        putchar(0x20);
      }
      if (rows - 1 == uVar5) {
        printf("| ");
      }
      pRVar4 = pRVar4 + rows;
    }
    putchar(10);
    ab = ab + 1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_show_ab(REF_INT rows, REF_INT cols, REF_DBL *ab) {
  REF_INT row, col;

  for (row = 0; row < rows; row++) {
    for (col = 0; col < cols; col++) {
      printf("%12.4e", ab[row + rows * col]);
      if (col < cols - 1) printf(" ");
      if (col == rows - 1) printf("| ");
    }
    printf("\n");
  }
  return REF_SUCCESS;
}